

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcCompositeProfileDef::IfcCompositeProfileDef
          (IfcCompositeProfileDef *this)

{
  *(undefined ***)&this->field_0xa8 = &PTR__Object_0073a1d0;
  *(undefined8 *)&this->field_0xb0 = 0;
  *(char **)&this->field_0xb8 = "IfcCompositeProfileDef";
  IfcProfileDef::IfcProfileDef(&this->super_IfcProfileDef,&PTR_construction_vtable_24__0076fcc0);
  *(undefined8 *)&(this->super_IfcProfileDef).field_0x60 = 0;
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x76fc58;
  *(undefined8 *)&this->field_0xa8 = 0x76fca8;
  *(undefined8 *)&(this->super_IfcProfileDef).field_0x58 = 0x76fc80;
  *(undefined8 *)&(this->super_IfcProfileDef).field_0x68 = 0;
  *(undefined8 *)&this->field_0x70 = 0;
  *(undefined8 *)&this->field_0x78 = 0;
  (this->Label).ptr._M_dataplus._M_p = (pointer)&(this->Label).ptr.field_2;
  (this->Label).ptr._M_string_length = 0;
  (this->Label).ptr.field_2._M_local_buf[0] = '\0';
  (this->Label).have = false;
  return;
}

Assistant:

IfcCompositeProfileDef() : Object("IfcCompositeProfileDef") {}